

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameColumnElistNames(Parse *pParse,RenameCtx *pCtx,ExprList *pEList,char *zOld)

{
  byte bVar1;
  char *pPtr;
  long lVar2;
  long lVar3;
  
  if ((pEList == (ExprList *)0x0) || (pEList->nExpr < 1)) {
    return;
  }
  lVar3 = 0;
LAB_001ba1e6:
  if (((zOld != (char *)0x0) && ((*(ushort *)&pEList->a[lVar3].fg.field_0x1 & 3) == 0)) &&
     (pPtr = pEList->a[lVar3].zEName, pPtr != (char *)0x0)) {
    lVar2 = 0;
    do {
      bVar1 = pPtr[lVar2];
      if (bVar1 == zOld[lVar2]) {
        if ((ulong)bVar1 == 0) goto LAB_001ba230;
      }
      else if (""[bVar1] != ""[(byte)zOld[lVar2]]) break;
      lVar2 = lVar2 + 1;
    } while( true );
  }
  goto LAB_001ba23c;
LAB_001ba230:
  renameTokenFind(pParse,pCtx,pPtr);
LAB_001ba23c:
  lVar3 = lVar3 + 1;
  if (pEList->nExpr <= lVar3) {
    return;
  }
  goto LAB_001ba1e6;
}

Assistant:

static void renameColumnElistNames(
  Parse *pParse,
  RenameCtx *pCtx,
  const ExprList *pEList,
  const char *zOld
){
  if( pEList ){
    int i;
    for(i=0; i<pEList->nExpr; i++){
      const char *zName = pEList->a[i].zEName;
      if( ALWAYS(pEList->a[i].fg.eEName==ENAME_NAME)
       && ALWAYS(zName!=0)
       && 0==sqlite3_stricmp(zName, zOld)
      ){
        renameTokenFind(pParse, pCtx, (const void*)zName);
      }
    }
  }
}